

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::paintEvent(DateTimePicker *this,QPaintEvent *param_1)

{
  QPalette *this_00;
  QColor *baseColor;
  long lVar1;
  DateTimePickerPrivate *this_01;
  int iVar2;
  long lVar3;
  QPainter p;
  QRect r;
  QStyleOption opt;
  
  DateTimePickerPrivate::normalizeOffsets((this->d).d);
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  this_01 = (this->d).d;
  lVar1 = 8;
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < (this_01->super_DateTimeParser).sections.d.size; lVar3 = lVar3 + 1) {
    r.y1 = 0;
    r.x2 = *(int *)((long)&((this_01->super_DateTimeParser).sections.d.ptr)->type + lVar1) + iVar2 +
           -1;
    r.y2 = this_01->widgetHeight + -1;
    r.x1 = iVar2;
    this_00 = (QPalette *)QWidget::palette();
    baseColor = QPalette::color(this_00,Dark);
    drawCylinder(&p,&r,baseColor,lVar3 == 0,
                 lVar3 == (((this->d).d)->super_DateTimeParser).sections.d.size + -1);
    DateTimePickerPrivate::drawSectionItems((this->d).d,(int)lVar3,&p,&opt);
    this_01 = (this->d).d;
    iVar2 = iVar2 + *(int *)((long)&((this_01->super_DateTimeParser).sections.d.ptr)->type + lVar1);
    lVar1 = lVar1 + 0x30;
  }
  DateTimePickerPrivate::drawWindow(this_01,&p,&opt);
  QPainter::~QPainter(&p);
  QStyleOption::~QStyleOption(&opt);
  return;
}

Assistant:

void
DateTimePicker::paintEvent( QPaintEvent * )
{
	d->normalizeOffsets();

	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	int x = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		const QRect r( x, 0, d->sections.at( i ).sectionWidth, d->widgetHeight );

		drawCylinder( &p, r, palette().color( QPalette::Dark ),
			( i == 0 ), ( i == d->sections.size() - 1 ) );

		d->drawSectionItems( i, &p, opt );

		x += d->sections.at( i ).sectionWidth;
	}

	d->drawWindow( &p, opt );
}